

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O2

bool_t botpOCRAStart(void *state,char *suite,octet *key,size_t key_len)

{
  char cVar1;
  bool_t bVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  char *pcVar8;
  char *str;
  long lStack_50;
  char *local_40;
  
  sVar3 = botpOCRA_keep();
  memSet(state,'\0',sVar3);
  bVar2 = strStartsWith(suite,"OCRA-1:HOTP-");
  if (bVar2 == 0) {
    return 0;
  }
  sVar3 = strLen("OCRA-1:HOTP-");
  pcVar8 = suite + sVar3;
  bVar2 = strStartsWith(pcVar8,"HBELT");
  if (bVar2 == 0) {
    return 0;
  }
  str = "HBELT";
  sVar3 = strLen("HBELT");
  if (pcVar8[sVar3] != '-') {
    return 0;
  }
  if ((byte)(pcVar8[sVar3 + 1] - 0x3aU) < 0xfa) {
    return 0;
  }
  *(ulong *)state = (ulong)(byte)(pcVar8[sVar3 + 1] - 0x30);
  if (pcVar8[sVar3 + 2] != ':') {
    return 0;
  }
  cVar1 = pcVar8[sVar3 + 3];
  if (cVar1 == 'C') {
    if (pcVar8[sVar3 + 4] != '-') {
      return 0;
    }
    *(undefined8 *)((long)state + 0x18) = 8;
    cVar1 = pcVar8[sVar3 + 5];
    lVar4 = sVar3 + 5;
  }
  else {
    lVar4 = sVar3 + 3;
  }
  pcVar8 = pcVar8 + lVar4;
  if (cVar1 != 'Q') {
    return 0;
  }
  uVar7 = (byte)pcVar8[1] - 0x41;
  if (0xd < uVar7) {
    return 0;
  }
  if ((0x2081U >> (uVar7 & 0x1f) & 1) == 0) {
    return 0;
  }
  *(char *)((long)state + 0xa0) = pcVar8[1];
  if ((byte)(pcVar8[2] - 0x3aU) < 0xf6) {
    return 0;
  }
  if ((byte)(pcVar8[3] - 0x3aU) < 0xf6) {
    return 0;
  }
  uVar5 = (ulong)(byte)(pcVar8[2] * '\n' + 0x20);
  *(ulong *)((long)state + 0xa8) = uVar5;
  cVar1 = pcVar8[3];
  *(ulong *)((long)state + 0xa8) = uVar5 + (long)cVar1 + -0x30;
  if ((uVar5 + (long)cVar1) - 0x71 < 0xffffffffffffffc3) {
    return 0;
  }
  bVar2 = strStartsWith(pcVar8 + 4,"-P");
  local_40 = pcVar8 + 4;
  if (bVar2 != 0) {
    pcVar8 = pcVar8 + 6;
    bVar2 = strStartsWith(pcVar8,"HBELT");
    local_40 = (char *)0x20;
    if (bVar2 == 0) {
      str = "SHA1";
      bVar2 = strStartsWith(pcVar8,"SHA1");
      if (bVar2 == 0) {
        str = "SHA256";
        bVar2 = strStartsWith(pcVar8,"SHA256");
        if (bVar2 != 0) goto LAB_001388d8;
        str = "SHA512";
        bVar2 = strStartsWith(pcVar8,"SHA512");
        if (bVar2 == 0) {
          return 0;
        }
        lStack_50 = 0x40;
      }
      else {
        lStack_50 = 0x14;
      }
      local_40 = (char *)lStack_50;
    }
LAB_001388d8:
    sVar3 = strLen(str);
    *(char **)((long)state + 0xf0) = local_40;
    local_40 = pcVar8 + sVar3;
  }
  bVar2 = strStartsWith(local_40,"-S");
  if (bVar2 != 0) {
    if ((byte)(local_40[2] - 0x3aU) < 0xf6) {
      return 0;
    }
    if ((byte)(local_40[3] - 0x3aU) < 0xf6) {
      return 0;
    }
    if ((byte)(local_40[4] - 0x3aU) < 0xf6) {
      return 0;
    }
    uVar5 = (ulong)(byte)(local_40[2] * '\n' + 0x20);
    *(ulong *)((long)state + 0x2f8) = uVar5;
    lVar4 = ((long)local_40[3] + uVar5) * 10;
    *(long *)((long)state + 0x2f8) = lVar4 + -0x1e0;
    uVar5 = (lVar4 + local_40[4]) - 0x210;
    *(ulong *)((long)state + 0x2f8) = uVar5;
    if (0x200 < uVar5) {
      return 0;
    }
    local_40 = local_40 + 5;
  }
  bVar2 = strStartsWith(local_40,"-T");
  if (bVar2 != 0) {
    if ((byte)(local_40[2] - 0x3aU) < 0xf7) {
      return 0;
    }
    uVar5 = (ulong)(byte)(local_40[2] - 0x30);
    *(ulong *)((long)state + 0x308) = uVar5;
    cVar1 = local_40[3];
    if ((byte)(cVar1 - 0x30U) < 10) {
      *(ulong *)((long)state + 0x308) = uVar5 * 10;
      uVar5 = (uVar5 * 10 + (long)local_40[3]) - 0x30;
      *(ulong *)((long)state + 0x308) = uVar5;
      cVar1 = local_40[4];
      lStack_50 = 4;
    }
    else {
      lStack_50 = 3;
    }
    local_40 = local_40 + lStack_50 + 1;
    if (cVar1 == 'H') {
      lVar4 = 0xe10;
      if (0x30 < (long)uVar5) {
        return 0;
      }
    }
    else {
      if (cVar1 != 'M') {
        if (cVar1 != 'S') {
          return 0;
        }
        if (0x3b < (long)uVar5) {
          return 0;
        }
        goto LAB_00138a69;
      }
      if (0x3b < (long)uVar5) {
        return 0;
      }
      lVar4 = 0x3c;
    }
    *(ulong *)((long)state + 0x308) = uVar5 * lVar4;
  }
LAB_00138a69:
  cVar1 = *local_40;
  if (cVar1 == '\0') {
    sVar3 = beltHMAC_keep();
    beltHMACStart((void *)((long)state + sVar3 + 0x33a),key,key_len);
    sVar3 = strLen(suite);
    sVar6 = beltHMAC_keep();
    beltHMACStepA(suite,sVar3 + 1,(void *)((long)state + sVar6 + 0x33a));
  }
  return (uint)(cVar1 == '\0');
}

Assistant:

bool_t botpOCRAStart(void* state, const char* suite, const octet key[], 
	size_t key_len)
{
	botp_ocra_st* st = (botp_ocra_st*)state;
	const char* suite_save = suite;
	// pre
	ASSERT(strIsValid(suite));
	ASSERT(memIsDisjoint2(suite, strLen(suite) + 1, state, botpOCRA_keep()));
	ASSERT(memIsDisjoint2(key, key_len, state, botpOCRA_keep()));
	// подготовить state
	memSetZero(st, botpOCRA_keep());
	// разбор suite: префикс
	if (!strStartsWith(suite, ocra_prefix))
		return FALSE;
	suite += strLen(ocra_prefix);
	if (!strStartsWith(suite, ocra_hbelt))
		return FALSE;
	suite += strLen(ocra_hbelt);
	if (*suite++ != '-')
		return FALSE;
	// разбор suite: digit
	if (*suite < '4' || *suite > '9')
		return FALSE;
	st->digit = (size_t)(*suite++ - '0');
	// разбор suite: DataInput
	if (*suite++ != ':')
		return FALSE;
	// разбор suite: ctr
	if (*suite == 'C')
	{
		if (*++suite != '-')
			return FALSE;
		++suite;
		st->ctr_len = 8;
	}
	// разбор suite: q
	if (*suite++ != 'Q')
		return FALSE;
	switch (*suite)
	{
	case 'A':
	case 'N':
	case 'H':
		st->q_type = *suite++;
		break;
	default:
		return FALSE;
	}
	if (suite[0] < '0' || suite[0] > '9' || suite[1] < '0' || suite[1] > '9')
		return FALSE;
	st->q_max = (size_t)(suite[0] - '0');
	st->q_max *= 10, st->q_max += (size_t)(suite[1] - '0');
	if (st->q_max < 4 || st->q_max > 64)
		return FALSE;
	suite += 2;
	// разбор suite: p
	if (strStartsWith(suite, "-P"))
	{
		suite += 2;
		if (strStartsWith(suite, ocra_hbelt))
		{
			suite += strLen(ocra_hbelt);
			st->p_len = 32;
		}
		else if (strStartsWith(suite, ocra_sha1))
		{
			suite += strLen(ocra_sha1);
			st->p_len = 20;
		}
		else if (strStartsWith(suite, ocra_sha256))
		{
			suite += strLen(ocra_sha256);
			st->p_len = 32;
		}
		else if (strStartsWith(suite, ocra_sha512))
		{
			suite += strLen(ocra_sha512);
			st->p_len = 64;
		}
		else
			return FALSE;
	}
	// разбор suite: s
	if (strStartsWith(suite, "-S"))
	{
		suite += 2;
		if (suite[0] < '0' || suite[0] > '9' || 
			suite[1] < '0' || suite[1] > '9' ||
			suite[2] < '0' || suite[2] > '9')
			return FALSE;
		st->s_len = (size_t)(suite[0] - '0');
		st->s_len *= 10, st->s_len += (size_t)(suite[1] - '0');
		st->s_len *= 10, st->s_len += (size_t)(suite[2] - '0');
		if (st->s_len > 512)
			return FALSE;
		suite += 3;
	}
	// разбор suite: t
	if (strStartsWith(suite, "-T"))
	{
		suite += 2;
		if (*suite < '1' || *suite > '9')
			return FALSE;
		st->ts = (size_t)(*suite++ - '0');
		if (*suite >= '0' && *suite <= '9')
			st->ts *= 10, st->ts += (size_t)(*suite++ - '0');
		switch (*suite++)
		{
		case 'S':
			if (st->ts > 59)
				return FALSE;
			break;
		case 'M':
			if (st->ts > 59)
				return FALSE;
			st->ts *= 60;
			break;
		case 'H':
			if (st->ts > 48)
				return FALSE;
			st->ts *= 3600;
			break;
		default:
			return FALSE;
		}
	}
	// разбор suite: окончание
	if (*suite)
		return FALSE;
	// запуск HMAC 
	beltHMACStart(st->stack + beltHMAC_keep(), key, key_len);
	beltHMACStepA(suite_save, strLen(suite_save) + 1,
		st->stack + beltHMAC_keep());
	return TRUE;
}